

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.h
# Opt level: O0

ZyanStatus
ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *buffer,ZydisPredefinedToken *data)

{
  ulong uVar1;
  long lVar2;
  ZyanUSize local_40;
  ZyanUSize delta;
  ZydisFormatterToken *last;
  ZyanUSize len;
  ZydisPredefinedToken *data_local;
  ZydisFormatterBuffer *buffer_local;
  
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                  ,0xe3,
                  "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                 );
  }
  if (data != (ZydisPredefinedToken *)0x0) {
    uVar1 = (buffer->string).vector.size;
    if ((uVar1 != 0) && (uVar1 < 0x100)) {
      if (uVar1 + data->size < buffer->capacity) {
        *(char *)((long)(buffer->string).vector.data + -1) = (char)uVar1;
        memcpy((void *)((long)(buffer->string).vector.data + uVar1),data + 1,(ulong)data->size);
        lVar2 = uVar1 + data->next;
        buffer->capacity = buffer->capacity - lVar2;
        (buffer->string).vector.data = (void *)((long)(buffer->string).vector.data + lVar2);
        (buffer->string).vector.size = (long)(int)((uint)data->size - (uint)data->next);
        if (buffer->capacity < 0xff) {
          local_40 = buffer->capacity;
        }
        else {
          local_40 = 0xff;
        }
        (buffer->string).vector.capacity = local_40;
        buffer_local._4_4_ = 0x100000;
      }
      else {
        buffer_local._4_4_ = 0x80100009;
      }
      return buffer_local._4_4_;
    }
    __assert_fail("(len > 0) && (len < 256)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                  ,0xe7,
                  "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                 );
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                ,0xe4,
                "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
               );
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer* buffer,
    const ZydisPredefinedToken* data)
{
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(data);

    const ZyanUSize len = buffer->string.vector.size;
    ZYAN_ASSERT((len > 0) && (len < 256));
    if (buffer->capacity <= len + data->size)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZydisFormatterToken* const last = (ZydisFormatterToken*)buffer->string.vector.data - 1;
    last->next = (ZyanU8)len;

    ZYAN_MEMCPY((ZyanU8*)buffer->string.vector.data + len, &data->data[0], data->size);

    const ZyanUSize delta = len + data->next;
    buffer->capacity -= delta;
    buffer->string.vector.data = (ZyanU8*)buffer->string.vector.data + delta;
    buffer->string.vector.size = data->size - data->next;
    buffer->string.vector.capacity = ZYAN_MIN(buffer->capacity, 255);

    return ZYAN_STATUS_SUCCESS;
}